

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-dynamical-system.cpp
# Opt level: O3

Vector __thiscall
stateObservation::IMUDynamicalSystem::stateDynamics
          (IMUDynamicalSystem *this,Vector *x,Vector *u,TimeIndex param_3)

{
  long lVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  char cVar8;
  ulong uVar9;
  char *__function;
  Index extraout_RDX;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  Vector VVar19;
  Vector xk1;
  AngleAxis orientationAA;
  Quaternion orientation;
  DynamicalSystemFunctorBase local_198;
  _func_int **pp_Stack_190;
  _func_int *local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  AngleAxis<double> local_158;
  undefined1 local_138 [16];
  double local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  Quaternion local_d8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined1 local_48 [16];
  Vector3 local_38;
  
  cVar8 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[8])(x,u);
  if (cVar8 == '\0') {
    __assert_fail("checkStateVector(v) && \"ERROR: The state vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x40,
                  "void stateObservation::DynamicalSystemFunctorBase::assertStateVector_(const Vector &)"
                 );
  }
  cVar8 = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data[9])(x,param_3);
  if (cVar8 == '\0') {
    __assert_fail("checkInputvector(v) && \"ERROR: The input vector has the wrong size\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamical-system/dynamical-system-functor-base.hpp"
                  ,0x45,
                  "void stateObservation::DynamicalSystemFunctorBase::assertInputVector_(const Vector &)"
                 );
  }
  lVar1 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (((2 < lVar1) && (uVar9 = lVar1 - 3, 5 < uVar9)) && (0xb < uVar9)) {
    pdVar2 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_38.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = pdVar2[3];
    local_38.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = pdVar2[4];
    local_38.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = pdVar2[5];
    if (0xe < uVar9) {
      local_e8 = pdVar2[9];
      dStack_e0 = pdVar2[10];
      local_178 = pdVar2[0xb];
      local_f8 = pdVar2[0xf];
      dStack_f0 = pdVar2[0x10];
      local_180 = pdVar2[0x11];
      local_170 = pdVar2[2];
      local_168 = pdVar2[0xe];
      local_160 = pdVar2[8];
      local_98 = *pdVar2;
      dStack_90 = pdVar2[1];
      local_88 = pdVar2[0xc];
      dStack_80 = pdVar2[0xd];
      local_78 = pdVar2[6];
      dStack_70 = pdVar2[7];
      if (*(char *)&x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_data == '\x01') {
        if (uVar9 < 0x12) goto LAB_00147aed;
        local_138._8_4_ = SUB84(pdVar2[0x13] * 0.9999,0);
        local_138._0_8_ = pdVar2[0x12] * 0.9999;
        local_138._12_4_ = (int)((ulong)(pdVar2[0x13] * 0.9999) >> 0x20);
        local_188 = (_func_int *)(pdVar2[0x14] * 0.9999);
      }
      else {
        local_188 = (_func_int *)0x7ff8000000000000;
        local_138._8_8_ = 0x7ff8000000000000;
        local_138._0_8_ = 0x7ff8000000000000;
      }
      computeQuaternion_(&local_d8,(IMUDynamicalSystem *)x,&local_38);
      local_108 = (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows;
      local_b8 = local_108 * 0.5 * local_108;
      auVar18._0_8_ = local_f8 * local_b8 + local_e8 * local_108;
      auVar18._8_8_ = dStack_f0 * local_b8 + dStack_e0 * local_108;
      local_128 = local_180 * local_b8 + local_178 * local_108;
      dVar4 = local_128 * local_128 + auVar18._8_8_ * auVar18._8_8_ + auVar18._0_8_ * auVar18._0_8_;
      dVar6 = SQRT(dVar4);
      uStack_a0 = 0;
      if (9.999999999999999e-33 < dVar4) {
        auVar15._8_8_ = dVar6;
        auVar15._0_8_ = dVar6;
        local_48 = divpd(auVar18,auVar15);
      }
      else {
        local_48 = ZEXT816(0);
      }
      uStack_100 = 0;
      local_118._8_4_ = SUB84(local_108,0);
      local_118._0_8_ = local_108;
      local_118._12_4_ = (int)((ulong)local_108 >> 0x20);
      if (9.999999999999999e-33 < dVar4) {
        local_128 = local_128 / dVar6;
      }
      else {
        local_128 = 1.0;
      }
      uStack_120 = 0;
      local_68 = (double)(-(ulong)(9.999999999999999e-33 < dVar4) & (ulong)(dVar6 * 0.5));
      uStack_60 = 0;
      dStack_b0 = local_b8;
      local_a8 = local_b8;
      local_58 = cos(local_68);
      dVar10 = sin(local_68);
      dVar17 = local_128 * dVar10;
      dVar11 = dVar10 * (double)local_48._0_8_;
      dVar10 = dVar10 * (double)local_48._8_8_;
      dVar12 = dVar10 * local_d8.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[0];
      dVar14 = dVar10 * local_d8.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array[1];
      dVar4 = dVar11 * local_d8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[0];
      dVar6 = dVar11 * local_d8.m_coeffs.
                       super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                       .array[1];
      dVar7 = local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0] * dVar17 -
              local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2] * dVar11;
      auVar16._8_4_ = SUB84(dVar7,0);
      auVar16._0_8_ =
           local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1] * dVar17 -
           local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[3] * dVar11;
      auVar16._12_4_ = (int)((ulong)dVar7 >> 0x20);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] =
           SUB168(auVar16 ^ _DAT_001987c0,0) +
           local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[2] * dVar10 +
           local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[0] * local_58;
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] =
           SUB168(auVar16 ^ _DAT_001987c0,8) +
           local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[3] * dVar10 +
           local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
           m_data.array[1] * local_58;
      dVar4 = dVar4 + dVar17 * local_d8.m_coeffs.
                               super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[2];
      auVar13._8_4_ = SUB84(dVar4,0);
      auVar13._0_8_ =
           dVar6 + dVar17 * local_d8.m_coeffs.
                            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                            m_data.array[3];
      auVar13._12_4_ = (int)((ulong)dVar4 >> 0x20);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[2] =
           SUB168(auVar13 ^ _DAT_001987d0,0) +
           (local_58 *
            local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[2] - dVar12);
      local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[3] =
           SUB168(auVar13 ^ _DAT_001987d0,8) +
           (local_58 *
            local_d8.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
            .m_data.array[3] - dVar14);
      local_158.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
      .array[0] = (double)(*(code *)(x->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data[5])(x);
      local_158.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
      .array[2] = 0.0;
      if ((long)local_158.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0] < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_198,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_158);
      if (2 < (long)pp_Stack_190) {
        *local_198._vptr_DynamicalSystemFunctorBase =
             (_func_int *)(local_98 + local_b8 * local_88 + local_78 * (double)local_118._0_8_);
        local_198._vptr_DynamicalSystemFunctorBase[1] =
             (_func_int *)(dStack_90 + dStack_b0 * dStack_80 + dStack_70 * (double)local_118._8_8_);
        local_198._vptr_DynamicalSystemFunctorBase[2] =
             (_func_int *)(local_170 + local_a8 * local_168 + local_160 * local_108);
        if (8 < (long)pp_Stack_190) {
          dVar4 = dStack_70 + dStack_80 * (double)local_118._8_8_;
          auVar3._8_4_ = SUB84(dVar4,0);
          auVar3._0_8_ = local_78 + local_88 * (double)local_118._0_8_;
          auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
          *(undefined1 (*) [16])(local_198._vptr_DynamicalSystemFunctorBase + 6) = auVar3;
          local_198._vptr_DynamicalSystemFunctorBase[8] =
               (_func_int *)(local_160 + local_168 * local_108);
          Eigen::AngleAxis<double>::operator=
                    (&local_158,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_d8);
          if (5 < (long)pp_Stack_190) {
            uVar9 = (long)pp_Stack_190 - 3;
            local_198._vptr_DynamicalSystemFunctorBase[3] =
                 (_func_int *)
                 (local_158.m_angle *
                 local_158.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0]);
            local_198._vptr_DynamicalSystemFunctorBase[4] =
                 (_func_int *)
                 (local_158.m_angle *
                 local_158.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1]);
            local_198._vptr_DynamicalSystemFunctorBase[5] =
                 (_func_int *)
                 (local_158.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[2] * local_158.m_angle);
            if (8 < uVar9) {
              local_198._vptr_DynamicalSystemFunctorBase[9] =
                   (_func_int *)(local_e8 + local_f8 * (double)local_118._0_8_);
              local_198._vptr_DynamicalSystemFunctorBase[10] =
                   (_func_int *)(dStack_e0 + dStack_f0 * (double)local_118._8_8_);
              local_198._vptr_DynamicalSystemFunctorBase[0xb] =
                   (_func_int *)(local_178 + local_180 * local_108);
              lVar1 = *(long *)(param_3 + 8);
              if (lVar1 < 3) goto LAB_00147aed;
              if (0xb < uVar9) {
                pdVar2 = *(double **)param_3;
                dVar10 = pdVar2[lVar1 + -3];
                dVar11 = (pdVar2 + lVar1 + -3)[1];
                dVar4 = pdVar2[lVar1 + -1];
                dVar6 = (double)x[0x12].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows;
                dVar12 = pdVar2[1];
                dVar7 = pdVar2[2];
                local_198._vptr_DynamicalSystemFunctorBase[0xc] =
                     (_func_int *)
                     ((double)local_198._vptr_DynamicalSystemFunctorBase[0xc] + dVar6 * *pdVar2);
                local_198._vptr_DynamicalSystemFunctorBase[0xd] =
                     (_func_int *)
                     ((double)local_198._vptr_DynamicalSystemFunctorBase[0xd] + dVar6 * dVar12);
                local_198._vptr_DynamicalSystemFunctorBase[0xe] =
                     (_func_int *)
                     (dVar6 * dVar7 + (double)local_198._vptr_DynamicalSystemFunctorBase[0xe]);
                if (0xe < uVar9) {
                  dVar6 = (double)x[0x12].
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows;
                  dVar7 = (double)local_198._vptr_DynamicalSystemFunctorBase[0x10] + dVar11 * dVar6;
                  auVar5._8_4_ = SUB84(dVar7,0);
                  auVar5._0_8_ = (double)local_198._vptr_DynamicalSystemFunctorBase[0xf] +
                                 dVar10 * dVar6;
                  auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
                  *(undefined1 (*) [16])(local_198._vptr_DynamicalSystemFunctorBase + 0xf) = auVar5;
                  local_198._vptr_DynamicalSystemFunctorBase[0x11] =
                       (_func_int *)
                       (dVar4 * dVar6 + (double)local_198._vptr_DynamicalSystemFunctorBase[0x11]);
                  if (*(char *)&x[0x17].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data != '\x01') {
LAB_00147a8f:
                    pdVar2 = x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data;
                    if (pdVar2 == (double *)0x0) {
                      (this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase =
                           local_198._vptr_DynamicalSystemFunctorBase;
                      (this->sensor_).super_AlgebraicSensor.super_SensorBase._vptr_SensorBase =
                           pp_Stack_190;
                      local_198._vptr_DynamicalSystemFunctorBase = (_func_int **)0x0;
                      pp_Stack_190 = (_func_int **)0x0;
                    }
                    else {
                      (**(code **)((long)*pdVar2 + 0x10))(this,pdVar2,&local_198);
                    }
                    free(local_198._vptr_DynamicalSystemFunctorBase);
                    VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows = extraout_RDX;
                    VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data = (double *)this;
                    return (Vector)VVar19.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage;
                  }
                  if (0x11 < uVar9) {
                    local_198._vptr_DynamicalSystemFunctorBase[0x12] = (_func_int *)local_138._0_8_;
                    local_198._vptr_DynamicalSystemFunctorBase[0x13] = (_func_int *)local_138._8_8_;
                    local_198._vptr_DynamicalSystemFunctorBase[0x14] = local_188;
                    goto LAB_00147a8f;
                  }
                }
              }
            }
          }
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_00147b02;
    }
  }
LAB_00147aed:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_00147b02:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

Vector IMUDynamicalSystem::stateDynamics(const Vector & x, const Vector & u, TimeIndex)
{
  assertStateVector_(x);
  assertInputVector_(u);

  Vector3 position = x.segment<3>(indexes::pos);
  Vector3 velocity = x.segment<3>(indexes::linVel);
  Vector3 acceleration = x.segment<3>(indexes::linAcc);

  Vector3 orientationV = x.segment<3>(indexes::ori);
  Vector3 angularVelocity = x.segment<3>(indexes::angVel);
  Vector3 angularAcceleration = x.segment<3>(indexes::angAcc);

  Vector3 gyroBias;
  if(withGyroBias_)
  {
    gyroBias = x.segment<3>(indexes::gyroBias);
  }

  Quaternion orientation = computeQuaternion_(orientationV);

  kine::integrateKinematics(position, velocity, acceleration, orientation, angularVelocity, angularAcceleration, dt_);

  // x_{k+1}
  Vector xk1 = Vector::Zero(getStateSize(), 1);

  xk1.segment<3>(indexes::pos) = position;
  xk1.segment<3>(indexes::linVel) = velocity;

  AngleAxis orientationAA(orientation);

  orientationV = orientationAA.angle() * orientationAA.axis();

  xk1.segment<3>(indexes::ori) = orientationV;
  xk1.segment<3>(indexes::angVel) = angularVelocity;

  // inputs
  Vector3 linearJerkInput = u.head<3>();
  Vector3 angularJerkInput = u.tail<3>();

  xk1.segment<3>(indexes::linAcc) += linearJerkInput * dt_;
  xk1.segment<3>(indexes::angAcc) += angularJerkInput * dt_;

  if(withGyroBias_)
  {
    xk1.segment<3>(indexes::gyroBias) = gyroBias * one_;
  }

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}